

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

void blake2b_compress(blake2b_state *S,uint8_t *block)

{
  uint64_t uVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t i;
  uint64_t v [16];
  uint64_t m [16];
  ulong local_120;
  ulong local_108 [8];
  ulong local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint64_t local_88 [4];
  long lStack_68;
  long lStack_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  long lStack_40;
  long lStack_38;
  long lStack_30;
  long lStack_28;
  long lStack_20;
  long lStack_18;
  long lStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_88,0xaa,0x80);
  memset(local_108,0xaa,0x80);
  for (local_120 = 0; local_120 < 0x10; local_120 = local_120 + 1) {
    uVar1 = load64((void *)(in_RSI + local_120 * 8));
    local_88[local_120] = uVar1;
  }
  for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
    local_108[local_120] = *(ulong *)(in_RDI + local_120 * 8);
  }
  local_c8 = 0x6a09e667f3bcc908;
  local_c0 = 0xbb67ae8584caa73b;
  local_b8 = 0x3c6ef372fe94f82b;
  local_b0 = 0xa54ff53a5f1d36f1;
  local_a8 = *(ulong *)(in_RDI + 0x40) ^ 0x510e527fade682d1;
  local_a0 = *(ulong *)(in_RDI + 0x48) ^ 0x9b05688c2b3e6c1f;
  local_98 = *(ulong *)(in_RDI + 0x50) ^ 0x1f83d9abfb41bd6b;
  local_90 = *(ulong *)(in_RDI + 0x58) ^ 0x5be0cd19137e2179;
  local_108[0] = local_108[0] + local_108[4] + local_88[0];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + local_88[1];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + local_88[2];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + local_88[3];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_68;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_58;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_50;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_48;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_40;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_20;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_18;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_10;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_18;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_40;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_10;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_20;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_58;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + local_88[1];
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_28;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + local_88[0];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + local_88[2];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + local_88[3];
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_48;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + local_88[0];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + local_88[2];
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_10;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_20;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_38;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_18;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + local_88[3];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_58;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + local_88[1];
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_40;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_68;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + local_88[3];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + local_88[1];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_20;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_28;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_30;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_18;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + local_88[2];
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_58;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_60;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + local_88[0];
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_10;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_48;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + local_88[0];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_60;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + local_88[2];
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_68;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_38;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_10;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_18;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + local_88[1];
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + local_88[3];
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_20;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + local_88[2];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_38;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + local_88[0];
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_30;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_48;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + local_88[3];
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_68;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_20;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_60;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_10;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_18;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + local_88[1];
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_40;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_28;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_60;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + local_88[1];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_10;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_18;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_20;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_68;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_38;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + local_88[0];
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_50;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_58;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + local_88[3];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_40;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + local_88[2];
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_48;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_30;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_18;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_28;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + local_88[1];
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + local_88[3];
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_40;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_60;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + local_88[0];
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_10;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_68;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_58;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + local_88[2];
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_38;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_58;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_10;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_18;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_40;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_30;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + local_88[3];
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + local_88[0];
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_48;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_28;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + local_88[2];
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_20;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_50;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + local_88[1];
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_38;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + local_88[2];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_50;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_58;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + local_88[1];
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_60;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_10;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_30;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_40;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_18;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + local_88[3];
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_20;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + local_88[0];
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + local_88[0];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + local_88[1];
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + local_88[2];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + local_88[3];
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_68;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_58;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_50;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + lStack_48;
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_40;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + lStack_30;
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_28;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_20;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_18;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + lStack_10;
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  local_108[0] = local_108[0] + local_108[4] + lStack_18;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x20);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x18);
  local_108[0] = local_108[0] + local_108[4] + lStack_38;
  local_a8 = rotr64(local_a8 ^ local_108[0],0x10);
  local_c8 = local_c8 + local_a8;
  local_108[4] = rotr64(local_108[4] ^ local_c8,0x3f);
  local_108[1] = local_108[1] + local_108[5] + lStack_68;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x20);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x18);
  local_108[1] = local_108[1] + local_108[5] + lStack_48;
  local_a0 = rotr64(local_a0 ^ local_108[1],0x10);
  local_c0 = local_c0 + local_a0;
  local_108[5] = rotr64(local_108[5] ^ local_c0,0x3f);
  local_108[2] = local_108[2] + local_108[6] + lStack_40;
  local_98 = rotr64(local_98 ^ local_108[2],0x20);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x18);
  local_108[2] = local_108[2] + local_108[6] + lStack_10;
  local_98 = rotr64(local_98 ^ local_108[2],0x10);
  local_b8 = local_b8 + local_98;
  local_108[6] = rotr64(local_108[6] ^ local_b8,0x3f);
  local_108[3] = local_108[3] + local_108[7] + lStack_20;
  local_90 = rotr64(local_90 ^ local_108[3],0x20);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x18);
  local_108[3] = local_108[3] + local_108[7] + lStack_58;
  local_90 = rotr64(local_90 ^ local_108[3],0x10);
  local_b0 = local_b0 + local_90;
  local_108[7] = rotr64(local_108[7] ^ local_b0,0x3f);
  local_108[0] = local_108[0] + local_108[5] + local_88[1];
  local_90 = rotr64(local_90 ^ local_108[0],0x20);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x18);
  local_108[0] = local_108[0] + local_108[5] + lStack_28;
  local_90 = rotr64(local_90 ^ local_108[0],0x10);
  local_b8 = local_b8 + local_90;
  local_108[5] = rotr64(local_108[5] ^ local_b8,0x3f);
  local_108[1] = local_108[1] + local_108[6] + local_88[0];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x20);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x18);
  local_108[1] = local_108[1] + local_108[6] + local_88[2];
  local_a8 = rotr64(local_a8 ^ local_108[1],0x10);
  local_b0 = local_b0 + local_a8;
  local_108[6] = rotr64(local_108[6] ^ local_b0,0x3f);
  local_108[2] = local_108[2] + local_108[7] + lStack_30;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x20);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x18);
  local_108[2] = local_108[2] + local_108[7] + lStack_50;
  local_a0 = rotr64(local_a0 ^ local_108[2],0x10);
  local_c8 = local_c8 + local_a0;
  local_108[7] = rotr64(local_108[7] ^ local_c8,0x3f);
  local_108[3] = local_108[3] + local_108[4] + lStack_60;
  local_98 = rotr64(local_98 ^ local_108[3],0x20);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x18);
  local_108[3] = local_108[3] + local_108[4] + local_88[3];
  local_98 = rotr64(local_98 ^ local_108[3],0x10);
  local_c0 = local_c0 + local_98;
  local_108[4] = rotr64(local_108[4] ^ local_c0,0x3f);
  for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
    *(ulong *)(in_RDI + local_120 * 8) =
         *(ulong *)(in_RDI + local_120 * 8) ^ local_108[local_120] ^ (&local_c8)[local_120];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2b_compress( blake2b_state *S, const uint8_t block[BLAKE2B_BLOCKBYTES] )
{
  uint64_t m[16];
  uint64_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load64( block + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2b_IV[0];
  v[ 9] = blake2b_IV[1];
  v[10] = blake2b_IV[2];
  v[11] = blake2b_IV[3];
  v[12] = blake2b_IV[4] ^ S->t[0];
  v[13] = blake2b_IV[5] ^ S->t[1];
  v[14] = blake2b_IV[6] ^ S->f[0];
  v[15] = blake2b_IV[7] ^ S->f[1];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );
  ROUND( 10 );
  ROUND( 11 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}